

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

void ThreadCleanupRoutine
               (CPalThread *pThread,IPalObject *pObjectToCleanup,bool fShutdown,
               bool fCleanupSharedState)

{
  int iVar1;
  undefined8 *puStack_38;
  PAL_ERROR palError;
  IDataLock *pDataLock;
  CPalThread *pThreadToCleanup;
  CThreadProcessLocalData *pThreadData;
  bool fCleanupSharedState_local;
  IPalObject *pIStack_18;
  bool fShutdown_local;
  IPalObject *pObjectToCleanup_local;
  CPalThread *pThread_local;
  
  pThreadToCleanup = (CPalThread *)0x0;
  pDataLock = (IDataLock *)0x0;
  puStack_38 = (undefined8 *)0x0;
  pThreadData._6_1_ = fCleanupSharedState;
  pThreadData._7_1_ = fShutdown;
  pIStack_18 = pObjectToCleanup;
  pObjectToCleanup_local = (IPalObject *)pThread;
  iVar1 = (*pObjectToCleanup->_vptr_IPalObject[3])
                    (pObjectToCleanup,pThread,1,&stack0xffffffffffffffc8,&pThreadToCleanup);
  if (iVar1 == 0) {
    pDataLock = (IDataLock *)pThreadToCleanup->_vptr_CPalThread;
    pThreadToCleanup->_vptr_CPalThread = (_func_int **)0x0;
    (**(code **)*puStack_38)(puStack_38,pObjectToCleanup_local,1);
    CorUnix::CPalThread::ReleaseThreadReference((CPalThread *)pDataLock);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","ThreadCleanupRoutine",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x8d2);
    fprintf(_stderr,"Unable to obtain thread data");
  }
  return;
}

Assistant:

void
ThreadCleanupRoutine(
    CPalThread *pThread,
    IPalObject *pObjectToCleanup,
    bool fShutdown,
    bool fCleanupSharedState
    )
{
    CThreadProcessLocalData *pThreadData = NULL;
    CPalThread *pThreadToCleanup = NULL;
    IDataLock *pDataLock = NULL;
    PAL_ERROR palError = NO_ERROR;

    //
    // Free the CPalThread data for the passed in thread
    //

    palError = pObjectToCleanup->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pThreadData)
        );

    if (NO_ERROR == palError)
    {
        //
        // Note that we may be cleaning up the data for the calling
        // thread (i.e., pThread == pThreadToCleanup), so the release
        // of the thread reference needs to be the last thing that
        // we do (though in that case it's very likely that the person
        // calling us will be holding an extra reference to allow
        // for the thread data to be available while the rest of the
        // object cleanup takes place).
        //

        pThreadToCleanup = pThreadData->pThread;
        pThreadData->pThread = NULL;
        pDataLock->ReleaseLock(pThread, TRUE);
        pThreadToCleanup->ReleaseThreadReference();
    }
    else
    {
        ASSERT("Unable to obtain thread data");
    }

}